

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O3

void __thiscall
flatbuffers::lobster::LobsterGenerator::StructBuilderBody
          (LobsterGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDef *name;
  StructDef *struct_def_00;
  char *pcVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  pointer ppFVar10;
  long *local_130;
  undefined8 local_128;
  long local_120;
  undefined8 uStack_118;
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string *local_b0;
  LobsterGenerator *local_a8;
  string local_a0;
  string local_80;
  StructDef *local_60;
  char *local_58;
  string local_50;
  
  local_b0 = code_ptr;
  local_a8 = this;
  local_60 = struct_def;
  local_58 = nameprefix;
  NumToString<unsigned_long>(&local_80,struct_def->minalign);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x3723fe);
  local_d0 = &local_c0;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_c0 = *plVar5;
    lStack_b8 = plVar3[3];
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*plVar3;
  }
  local_c8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
  paVar1 = &local_110.field_2;
  puVar6 = (ulong *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6) {
    local_110.field_2._M_allocated_capacity = *puVar6;
    local_110.field_2._8_8_ = plVar3[3];
    local_110._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_110.field_2._M_allocated_capacity = *puVar6;
    local_110._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_110._M_string_length = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  NumToString<unsigned_long>(&local_a0,local_60->bytesize);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    uVar8 = local_110.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_a0._M_string_length + local_110._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      uVar8 = local_a0.field_2._M_allocated_capacity;
    }
    if (local_a0._M_string_length + local_110._M_string_length <= (ulong)uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_a0,0,(char *)0x0,(ulong)local_110._M_dataplus._M_p);
      goto LAB_002a0de2;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_a0._M_dataplus._M_p);
LAB_002a0de2:
  local_130 = &local_120;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_120 = *plVar3;
    uStack_118 = puVar4[3];
  }
  else {
    local_120 = *plVar3;
    local_130 = (long *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_e0 = *plVar5;
    lStack_d8 = plVar3[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar5;
    local_f0 = (long *)*plVar3;
  }
  local_e8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_f0);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  ppFVar10 = (local_60->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppFVar10 ==
        (local_60->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      return;
    }
    name = ppFVar10[-1];
    if (name->padding != 0) {
      NumToString<unsigned_long>(&local_110,name->padding);
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x37240b)
      ;
      plVar3 = puVar4 + 2;
      if ((long *)*puVar4 == plVar3) {
        local_120 = *plVar3;
        uStack_118 = puVar4[3];
        local_130 = &local_120;
      }
      else {
        local_120 = *plVar3;
        local_130 = (long *)*puVar4;
      }
      local_128 = puVar4[1];
      *puVar4 = plVar3;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_e0 = *plVar5;
        lStack_d8 = plVar3[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar5;
        local_f0 = (long *)*plVar3;
      }
      local_e8 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_f0);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
    }
    if (((name->value).type.base_type == BASE_TYPE_STRUCT) &&
       (struct_def_00 = (name->value).type.struct_def, struct_def_00->fixed == true)) {
      EscapeKeyword(&local_110,local_a8,(string *)name);
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
      pcVar2 = local_58;
      plVar3 = puVar4 + 2;
      if ((long *)*puVar4 == plVar3) {
        local_120 = *plVar3;
        uStack_118 = puVar4[3];
        local_130 = &local_120;
      }
      else {
        local_120 = *plVar3;
        local_130 = (long *)*puVar4;
      }
      local_128 = puVar4[1];
      *puVar4 = plVar3;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      strlen(local_58);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)pcVar2);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_e0 = *plVar5;
        lStack_d8 = plVar3[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar5;
        local_f0 = (long *)*plVar3;
      }
      local_e8 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      StructBuilderBody(local_a8,struct_def_00,(char *)local_f0,local_b0);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120 + 1);
      }
      uVar8 = local_110.field_2._M_allocated_capacity;
      _Var9._M_p = local_110._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
LAB_002a1515:
        operator_delete(_Var9._M_p,uVar8 + 1);
      }
    }
    else {
      GenMethod_abi_cxx11_(&local_a0,local_a8,&(name->value).type);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x372490);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      psVar7 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_80.field_2._M_allocated_capacity = *psVar7;
        local_80.field_2._8_8_ = plVar3[3];
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar7;
        local_80._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_80._M_string_length = plVar3[1];
      *plVar3 = (long)psVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
      paVar1 = &local_110.field_2;
      local_d0 = &local_c0;
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_c0 = *plVar5;
        lStack_b8 = plVar3[3];
      }
      else {
        local_c0 = *plVar5;
        local_d0 = (long *)*plVar3;
      }
      local_c8 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
      puVar6 = (ulong *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_110.field_2._M_allocated_capacity = *puVar6;
        local_110.field_2._8_8_ = plVar3[3];
        local_110._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_110.field_2._M_allocated_capacity = *puVar6;
        local_110._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_110._M_string_length = plVar3[1];
      *plVar3 = (long)puVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      EscapeKeyword(&local_50,local_a8,(string *)name);
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        uVar8 = local_110.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_50._M_string_length + local_110._M_string_length) {
        uVar8 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          uVar8 = local_50.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar8 < local_50._M_string_length + local_110._M_string_length)
        goto LAB_002a1297;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_50,0,(char *)0x0,(ulong)local_110._M_dataplus._M_p);
      }
      else {
LAB_002a1297:
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_110,(ulong)local_50._M_dataplus._M_p);
      }
      plVar3 = puVar4 + 2;
      if ((long *)*puVar4 == plVar3) {
        local_120 = *plVar3;
        uStack_118 = puVar4[3];
        local_130 = &local_120;
      }
      else {
        local_120 = *plVar3;
        local_130 = (long *)*puVar4;
      }
      local_128 = puVar4[1];
      *puVar4 = plVar3;
      puVar4[1] = 0;
      *(undefined1 *)plVar3 = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_e0 = *plVar5;
        lStack_d8 = plVar3[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar5;
        local_f0 = (long *)*plVar3;
      }
      local_e8 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_f0);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      uVar8 = local_a0.field_2._M_allocated_capacity;
      _Var9._M_p = local_a0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) goto LAB_002a1515;
    }
    ppFVar10 = ppFVar10 + -1;
  } while( true );
}

Assistant:

void StructBuilderBody(const StructDef &struct_def, const char *nameprefix,
                         std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "    b_.Prep(" + NumToString(struct_def.minalign) + ", " +
            NumToString(struct_def.bytesize) + ")\n";
    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      if (field.padding)
        code += "    b_.Pad(" + NumToString(field.padding) + ")\n";
      if (IsStruct(field.value.type)) {
        StructBuilderBody(*field.value.type.struct_def,
                          (nameprefix + (NormalizedName(field) + "_")).c_str(),
                          code_ptr);
      } else {
        code += "    b_.Prepend" + GenMethod(field.value.type) + "(" +
                nameprefix + NormalizedName(field) + ")\n";
      }
    }
  }